

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::Common::DynamicString::from(DynamicString *this,char *str,size_t len)

{
  size_t sVar1;
  char *pcVar2;
  size_t local_30;
  size_t len_local;
  char *str_local;
  DynamicString *this_local;
  
  ~DynamicString(this);
  local_30 = len;
  if (len == 0) {
    sVar1 = strlen(str);
    local_30 = sVar1 + 1;
  }
  this->length = (uint16)local_30;
  pcVar2 = (char *)Platform::malloc((ulong)this->length);
  this->data = pcVar2;
  memcpy(this->data,str,(ulong)this->length);
  this->data[(int)(this->length - 1)] = '\0';
  return;
}

Assistant:

void from(const char * str, const size_t len = 0) { this->~DynamicString(); length = len ? len : (strlen(str)+1); data = (char*)Platform::malloc(length); memcpy(data, str, length); data[length - 1] = 0; }